

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O1

Vector __thiscall stateObservation::kine::regulateOrientationVector(kine *this,Vector3 *v)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  void *pvVar5;
  undefined8 *puVar6;
  Index in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator;
  undefined1 auVar7 [16];
  Vector VVar8;
  
  dVar3 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar1 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar1 = dVar1 * dVar1 + dVar4 * dVar4 + dVar3 * dVar3;
  if (dVar1 <= 22.206609902451056) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    if (*(long *)(this + 8) != 3) {
      free(*(void **)this);
      pvVar5 = malloc(0x18);
      if (((ulong)pvVar5 & 0xf) != 0) goto LAB_00107298;
      if (pvVar5 == (void *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)this = pvVar5;
      in_RDX = extraout_RDX;
    }
    *(undefined8 *)(this + 8) = 3;
    pdVar2 = *(double **)this;
    dVar1 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [1];
    *pdVar2 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
    pdVar2[1] = dVar1;
    pdVar2[2] = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[2];
  }
  else {
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar3 = ceil((dVar1 + -3.141592653589793) / 6.283185307179586);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    in_RDX = extraout_RDX_00;
    if (*(long *)(this + 8) != 3) {
      free(*(void **)this);
      pvVar5 = malloc(0x18);
      if (((ulong)pvVar5 & 0xf) != 0) {
LAB_00107298:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pvVar5 == (void *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)this = pvVar5;
      in_RDX = extraout_RDX_01;
    }
    dVar3 = (double)(uint)((int)(long)dVar3 * 2) * -3.141592653589793 + dVar1;
    *(undefined8 *)(this + 8) = 3;
    pdVar2 = *(double **)this;
    auVar7._8_8_ = dVar1;
    auVar7._0_8_ = dVar1;
    auVar7 = divpd(*(undefined1 (*) [16])
                    (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                    m_data.array,auVar7);
    *pdVar2 = dVar3 * auVar7._0_8_;
    pdVar2[1] = dVar3 * auVar7._8_8_;
    pdVar2[2] = ((v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[2] / dVar1) * dVar3;
  }
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = in_RDX;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline Vector regulateOrientationVector(const Vector3 & v)
{
  double n2 = v.squaredNorm();
  if(n2 > std::pow(3. / 2. * M_PI, 2))
  {
    double n = sqrt(n2);
    unsigned k = unsigned(ceil((n - M_PI) / (2 * M_PI)));
    return (v / n) * (n - k * 2 * M_PI);
  }
  else
  {
    return v;
  }
}